

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int wb_write_to_temp(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((0x4000 < s) && (*(long *)((long)a->format_data + 0x102e0) == 0x10000)) {
    uVar3 = s & 0xfffffffffffff800;
    plVar1 = (long *)((long)a->format_data + 0x102f0);
    *plVar1 = *plVar1 + uVar3;
    iVar2 = write_to_temp(a,buff,uVar3);
    if (iVar2 != 0) {
      return -0x1e;
    }
    uVar4 = s & 0x7ff;
    s = (size_t)((uint)s & 0x7ff);
    if (uVar4 == 0) {
      return 0;
    }
    buff = (void *)((long)buff + uVar3);
  }
  do {
    if (s == 0) {
      return 0;
    }
    uVar3 = *(ulong *)((long)a->format_data + 0x102e0);
    uVar4 = uVar3;
    if (s < uVar3) {
      uVar4 = s;
    }
    memcpy((void *)((long)a->format_data + (0x102dc - uVar3)),buff,uVar4);
    iVar2 = wb_consume(a,uVar4);
    s = s - uVar4;
    buff = (void *)((long)buff + uVar4);
  } while (iVar2 == 0);
  return -0x1e;
}

Assistant:

static int
wb_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	const char *xp = buff;
	size_t xs = s;

	/*
	 * If a written data size is big enough to use system-call
	 * and there is no waiting data, this calls write_to_temp() in
	 * order to reduce a extra memory copy.
	 */
	if (wb_remaining(a) == wb_buffmax() && s > (1024 * 16)) {
		struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
		xs = s % LOGICAL_BLOCK_SIZE;
		iso9660->wbuff_offset += s - xs;
		if (write_to_temp(a, buff, s - xs) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if (xs == 0)
			return (ARCHIVE_OK);
		xp += s - xs;
	}

	while (xs) {
		size_t size = xs;
		if (size > wb_remaining(a))
			size = wb_remaining(a);
		memcpy(wb_buffptr(a), xp, size);
		if (wb_consume(a, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xs -= size;
		xp += size;
	}
	return (ARCHIVE_OK);
}